

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::Array<kj::StringTree>::~Array(Array<kj::StringTree> *this)

{
  StringTree *pSVar1;
  size_t sVar2;
  
  pSVar1 = this->ptr;
  if (pSVar1 != (StringTree *)0x0) {
    sVar2 = this->size_;
    this->ptr = (StringTree *)0x0;
    this->size_ = 0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pSVar1,0x38,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }